

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::QuantizationParams::MergeFrom
          (QuantizationParams *this,QuantizationParams *from)

{
  void *pvVar1;
  LogMessage *other;
  LinearQuantizationParams *this_00;
  LookUpTableQuantizationParams *this_01;
  LinearQuantizationParams *from_00;
  LookUpTableQuantizationParams *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x68f2);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->numberofbits_ != 0) {
    this->numberofbits_ = from->numberofbits_;
  }
  if (from->_oneof_case_[0] != 0x66) {
    if (from->_oneof_case_[0] != 0x65) {
      return;
    }
    if (this->_oneof_case_[0] == 0x65) {
      this_00 = (this->QuantizationType_).linearquantization_;
    }
    else {
      clear_QuantizationType(this);
      this->_oneof_case_[0] = 0x65;
      this_00 = (LinearQuantizationParams *)operator_new(0x40);
      LinearQuantizationParams::LinearQuantizationParams(this_00);
      (this->QuantizationType_).linearquantization_ = this_00;
      if (from->_oneof_case_[0] != 0x65) {
        protobuf_NeuralNetwork_2eproto::InitDefaults();
        from_00 = (LinearQuantizationParams *)&_LinearQuantizationParams_default_instance_;
        goto LAB_004810ad;
      }
    }
    from_00 = (from->QuantizationType_).linearquantization_;
LAB_004810ad:
    LinearQuantizationParams::MergeFrom(this_00,from_00);
    return;
  }
  if (this->_oneof_case_[0] == 0x66) {
    this_01 = (this->QuantizationType_).lookuptablequantization_;
  }
  else {
    clear_QuantizationType(this);
    this->_oneof_case_[0] = 0x66;
    this_01 = (LookUpTableQuantizationParams *)operator_new(0x28);
    LookUpTableQuantizationParams::LookUpTableQuantizationParams(this_01);
    (this->QuantizationType_).lookuptablequantization_ = this_01;
    if (from->_oneof_case_[0] != 0x66) {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (LookUpTableQuantizationParams *)&_LookUpTableQuantizationParams_default_instance_;
      goto LAB_004810c3;
    }
  }
  from_01 = (from->QuantizationType_).lookuptablequantization_;
LAB_004810c3:
  LookUpTableQuantizationParams::MergeFrom(this_01,from_01);
  return;
}

Assistant:

void QuantizationParams::MergeFrom(const QuantizationParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.QuantizationParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.numberofbits() != 0) {
    set_numberofbits(from.numberofbits());
  }
  switch (from.QuantizationType_case()) {
    case kLinearQuantization: {
      mutable_linearquantization()->::CoreML::Specification::LinearQuantizationParams::MergeFrom(from.linearquantization());
      break;
    }
    case kLookupTableQuantization: {
      mutable_lookuptablequantization()->::CoreML::Specification::LookUpTableQuantizationParams::MergeFrom(from.lookuptablequantization());
      break;
    }
    case QUANTIZATIONTYPE_NOT_SET: {
      break;
    }
  }
}